

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O0

QList<int> *
QXkbCommon::possibleKeys(xkb_state *state,QKeyEvent *event,bool superAsMeta,bool hyperAsMeta)

{
  bool bVar1;
  QKeyCombination *pQVar2;
  QList<QKeyCombination> *in_RDI;
  long in_FS_OFFSET;
  QList<QKeyCombination> *__range1;
  QList<int> *result;
  xkb_state *in_stack_00000038;
  QKeyCombination keyCombination;
  iterator __end1;
  iterator __begin1;
  QList<QKeyCombination> keyCombinations;
  QList<QKeyCombination> *this;
  QKeyCombination local_3c;
  QKeyCombination *local_38;
  iterator local_30;
  iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QList<int>::QList((QList<int> *)0xb3f31b);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  possibleKeyCombinations(in_stack_00000038,(QKeyEvent *)result,state._7_1_,state._6_1_);
  local_28.i = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QKeyCombination>::begin(this);
  local_30.i = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QKeyCombination>::end(this);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QKeyCombination>::iterator::operator!=(&local_28,local_30);
    if (!bVar1) break;
    local_3c.combination = -0x55555556;
    pQVar2 = QList<QKeyCombination>::iterator::operator*(&local_28);
    local_3c.combination = pQVar2->combination;
    QKeyCombination::toCombined(&local_3c);
    QList<int>::operator<<((QList<int> *)this,(parameter_type)((ulong)in_RDI >> 0x20));
    QList<QKeyCombination>::iterator::operator++(&local_28);
  }
  QList<QKeyCombination>::~QList((QList<QKeyCombination> *)0xb3f41f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<int> *)this;
}

Assistant:

QList<int> QXkbCommon::possibleKeys(xkb_state *state, const QKeyEvent *event,
                                    bool superAsMeta, bool hyperAsMeta)
{
    QList<int> result;
    auto keyCombinations = possibleKeyCombinations(state, event, superAsMeta, hyperAsMeta);
    for (auto keyCombination : keyCombinations)
        result << keyCombination.toCombined();

    return result;
}